

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O3

Json __thiscall
JFSON::anon_unknown_22::JsonParser::expect(JsonParser *this,string *expected,Json *res)

{
  undefined8 *puVar1;
  size_t sVar2;
  int iVar3;
  long *plVar4;
  element_type *peVar5;
  undefined8 *puVar6;
  element_type *extraout_RAX;
  undefined8 *in_RCX;
  ulong *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ulong uVar9;
  Json JVar10;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  undefined1 local_40 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  if (expected->_M_string_length == 0) {
    __assert_fail("i != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/guangqianpeng[P]JFSON/JFSON.cpp"
                  ,0x266,
                  "Json JFSON::(anonymous namespace)::JsonParser::expect(const string &, Json)");
  }
  uVar9 = expected->_M_string_length - 1;
  expected->_M_string_length = uVar9;
  iVar3 = std::__cxx11::string::compare
                    ((ulong)(expected->_M_dataplus)._M_p,uVar9,
                     (string *)
                     (res->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (iVar3 == 0) {
    expected->_M_string_length =
         (long)&((res->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base + expected->_M_string_length;
    sVar2 = in_RCX[1];
    peVar5 = (element_type *)0x0;
    in_RCX[1] = 0;
    this->str = (string *)*in_RCX;
    this->i = sVar2;
    *in_RCX = 0;
    _Var8._M_pi = extraout_RDX;
    goto LAB_001066c8;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "parse error: expected ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)res);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_40);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_90 = *puVar7;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar7;
    local_a0 = (ulong *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)(expected->_M_dataplus)._M_p);
  uVar9 = 0xf;
  if (local_a0 != &local_90) {
    uVar9 = local_90;
  }
  if (uVar9 < (ulong)(local_58 + local_98)) {
    uVar9 = 0xf;
    if (local_60 != local_50) {
      uVar9 = local_50[0];
    }
    if (uVar9 < (ulong)(local_58 + local_98)) goto LAB_0010660d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_0010660d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60);
  }
  local_80 = &local_70;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar6[3];
  }
  else {
    local_70 = *puVar1;
    local_80 = (undefined8 *)*puVar6;
  }
  local_78 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  JVar10 = fail(this,expected);
  _Var8._M_pi = JVar10.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_80 != &local_70) {
    operator_delete(local_80);
    _Var8._M_pi = extraout_RDX_00;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
    _Var8._M_pi = extraout_RDX_01;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
    _Var8._M_pi = extraout_RDX_02;
  }
  peVar5 = (element_type *)(local_40 + 0x10);
  if ((element_type *)local_40._0_8_ != peVar5) {
    operator_delete((void *)local_40._0_8_);
    peVar5 = extraout_RAX;
    _Var8._M_pi = extraout_RDX_03;
  }
LAB_001066c8:
  JVar10.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  JVar10.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  return (Json)JVar10.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json expect(const string &expected, Json res) {
        assert(i != 0);
        i--;
        if (str.compare(i, expected.length(), expected) == 0) {
            i += expected.length();
            return res;
        } else {
            return fail("parse error: expected " + expected + ", got " + str.substr(i, expected.length()));
        }
    }